

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  mtree *mtree;
  mtree_entry *pmVar2;
  mtree_option **ppmVar3;
  __mode_t p;
  int iVar4;
  int iVar5;
  mode_t mVar6;
  int *piVar7;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar8;
  archive_string *paVar9;
  size_t sVar10;
  mtree_entry *pmVar11;
  mtree_entry *pmVar12;
  ulong uVar13;
  size_t len;
  int64_t iVar14;
  char *pcVar15;
  char *pcVar16;
  size_t sVar17;
  long lVar18;
  mtree_entry *pmVar19;
  char *pcVar20;
  mtree_entry *pmVar21;
  mtree_option *pmVar22;
  ulong uVar23;
  __dev_t _Var24;
  uint uVar25;
  ulong uStack_120;
  uint local_fc;
  mtree_entry *local_f8;
  mtree_option *global;
  mtree_option **local_e8;
  mtree_entry *local_e0;
  long local_d8;
  archive_entry *sparse_entry;
  mtree_entry *local_c8;
  stat st_storage;
  
  mtree = (mtree *)a->format->data;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return -0x1e;
    }
    local_c8 = (mtree_entry *)&mtree->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    global = (mtree_option *)0x0;
    detect_form(a,(int *)&sparse_entry);
    local_f8 = (mtree_entry *)0x0;
    local_d8 = 1;
LAB_00131b0b:
    lVar18 = 0;
    uVar23 = 0;
LAB_00131b10:
    __s = __archive_read_ahead(a,1,(ssize_t *)&st_storage);
    _Var24 = st_storage.st_dev;
    if (__s != (void *)0x0) {
      if (-1 < (long)st_storage.st_dev) {
        pvVar8 = memchr(__s,10,st_storage.st_dev);
        if (pvVar8 != (void *)0x0) {
          _Var24 = (long)pvVar8 + (1 - (long)__s);
          st_storage.st_dev = _Var24;
        }
        if ((long)(_Var24 + uVar23) < 0x10000) {
          paVar9 = archive_string_ensure((archive_string *)mtree,_Var24 + uVar23 + 1);
          if (paVar9 != (archive_string *)0x0) {
            memcpy((mtree->line).s + uVar23,__s,st_storage.st_dev);
            __archive_read_consume(a,st_storage.st_dev);
            iVar4 = (int)sparse_entry;
            uStack_120 = st_storage.st_dev + uVar23;
            (mtree->line).s[uStack_120] = '\0';
            pmVar21 = (mtree_entry *)(mtree->line).s;
            pcVar15 = (char *)((long)&pmVar21->next + lVar18);
            do {
              cVar1 = *pcVar15;
              if (cVar1 == '\\') {
                pcVar16 = pcVar15 + 1;
                cVar1 = pcVar15[1];
                pcVar20 = pcVar16;
                if (cVar1 != '\\') {
                  if (cVar1 == '\0') goto LAB_00131c03;
                  pcVar20 = pcVar15;
                  if (cVar1 == '\n') {
                    memmove(pcVar15,pcVar16,(long)pmVar21 + (uStack_120 - (long)pcVar15) + 1);
                    uStack_120 = uStack_120 - 1;
                    pmVar21 = (mtree_entry *)(mtree->line).s;
                    pcVar15 = pcVar16;
                    goto LAB_00131c03;
                  }
                }
              }
              else {
                if (cVar1 == '\0') goto LAB_00131c03;
                if (cVar1 == '\n') goto LAB_00131c2f;
                pcVar20 = pcVar15;
                if (cVar1 == '#') goto LAB_00131bfb;
              }
              pcVar15 = pcVar20 + 1;
            } while( true );
          }
          pcVar15 = "Can\'t allocate working buffer";
          iVar4 = 0xc;
        }
        else {
          pcVar15 = "Line too long";
          iVar4 = 0x54;
        }
        archive_set_error(&a->archive,iVar4,pcVar15);
      }
      goto LAB_001321c2;
    }
    goto LAB_0013218f;
  }
LAB_00131707:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  local_f8 = (mtree_entry *)&mtree->current_dir;
  pmVar21 = mtree->this_entry;
  do {
    if (pmVar21 == (mtree_entry *)0x0) {
      return 1;
    }
    pcVar15 = pmVar21->name;
    if (((*pcVar15 == '.') && (pcVar15[1] == '.')) && (pcVar15[2] == '\0')) {
      pmVar21->used = '\x01';
      sVar17 = (mtree->current_dir).length;
      if (sVar17 != 0) {
        pcVar15 = (char *)local_f8->next;
        pcVar16 = pcVar15 + sVar17;
        do {
          pcVar20 = pcVar16;
          pcVar16 = pcVar20 + -1;
          if (pcVar16 < pcVar15) break;
        } while (*pcVar16 != '/');
        pcVar20 = pcVar20 + -2;
        if (pcVar16 < pcVar15) {
          pcVar20 = pcVar16;
        }
        (mtree->current_dir).length = (size_t)(pcVar20 + (1 - (long)pcVar15));
      }
    }
    else if (pmVar21->used == '\0') {
      pmVar21->used = '\x01';
      global = (mtree_option *)entry;
      archive_entry_set_filetype(entry,0x8000);
      archive_entry_set_size(entry,0);
      (mtree->contents_name).length = 0;
      local_fc = 0;
      iVar4 = parse_line(a,entry,mtree,pmVar21,(int *)&local_fc);
      pmVar19 = local_f8;
      if (pmVar21->full == '\0') {
        sVar17 = (mtree->current_dir).length;
        if (sVar17 != 0) {
          archive_strcat((archive_string *)local_f8,"/");
        }
        archive_strcat((archive_string *)pmVar19,pmVar21->name);
        archive_entry_copy_pathname(entry,(char *)pmVar19->next);
        mVar6 = archive_entry_filetype(entry);
        if (mVar6 != 0x4000) {
          (mtree->current_dir).length = sVar17;
        }
      }
      else {
        archive_entry_copy_pathname(entry,pmVar21->name);
        pmVar19 = pmVar21;
        while (pmVar19 = pmVar19->next, pmVar19 != (mtree_entry *)0x0) {
          if (((pmVar19->full != '\0') && (pmVar19->used == '\0')) &&
             (iVar5 = strcmp(pmVar21->name,pmVar19->name), iVar5 == 0)) {
            pmVar19->used = '\x01';
            iVar5 = parse_line(a,entry,mtree,pmVar19,(int *)&local_fc);
            if (iVar5 < iVar4) {
              iVar4 = iVar5;
            }
          }
        }
      }
      if (mtree->checkfs == '\0') goto LAB_0013214c;
      mtree->fd = -1;
      if ((mtree->contents_name).length == 0) {
        pcVar15 = archive_entry_pathname(entry);
      }
      else {
        pcVar15 = (mtree->contents_name).s;
      }
      mVar6 = archive_entry_filetype(entry);
      if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(entry), mVar6 == 0x4000)) {
        iVar5 = open(pcVar15,0x80000);
        mtree->fd = iVar5;
        __archive_ensure_cloexec_flag(iVar5);
        iVar5 = mtree->fd;
        if (iVar5 == -1) {
          piVar7 = __errno_location();
          if ((*piVar7 != 2) || ((mtree->contents_name).length != 0)) {
            archive_set_error(&a->archive,*piVar7,"Can\'t open %s",pcVar15);
            iVar4 = -0x14;
          }
          goto LAB_001318ed;
        }
      }
      else {
LAB_001318ed:
        iVar5 = mtree->fd;
      }
      if (iVar5 < 0) {
        iVar5 = lstat(pcVar15,(stat *)&st_storage);
        if (iVar5 == -1) goto LAB_0013197c;
LAB_00131943:
        p = st_storage.st_mode;
        uVar25 = st_storage.st_mode & 0xf000;
        if (uVar25 == 0xa000) {
          mVar6 = archive_entry_filetype(entry);
          if (mVar6 != 0xa000) goto LAB_001319eb;
        }
        else if ((uVar25 != 0x8000) || (mVar6 = archive_entry_filetype(entry), mVar6 != 0x8000)) {
LAB_001319eb:
          if (((~p & 0xc000) != 0) || (mVar6 = archive_entry_filetype(entry), mVar6 != 0xc000)) {
            switch(uVar25 - 0x1000 >> 0xc) {
            case 0:
              mVar6 = archive_entry_filetype(entry);
              if (mVar6 == 0x1000) goto LAB_00132020;
              break;
            case 1:
              mVar6 = archive_entry_filetype(entry);
              if (mVar6 == 0x2000) goto LAB_00132020;
              break;
            case 3:
              mVar6 = archive_entry_filetype(entry);
              if (mVar6 == 0x4000) goto LAB_00132020;
              break;
            case 5:
              mVar6 = archive_entry_filetype(entry);
              if (mVar6 == 0x6000) goto LAB_00132020;
            }
            if (-1 < mtree->fd) {
              close(mtree->fd);
            }
            mtree->fd = -1;
            if ((local_fc & 0x800) == 0) {
              if (iVar4 != 0) {
                return iVar4;
              }
              pcVar15 = archive_entry_pathname(entry);
              archive_set_error(&a->archive,-1,"mtree specification has different type for %s",
                                pcVar15);
              return -0x14;
            }
            goto LAB_00131a94;
          }
        }
LAB_00132020:
        uVar25 = local_fc;
        if (((local_fc & 0x1001) != 1) &&
           ((mVar6 = archive_entry_filetype(entry), mVar6 == 0x2000 ||
            (mVar6 = archive_entry_filetype(entry), mVar6 == 0x6000)))) {
          archive_entry_set_rdev(entry,st_storage.st_rdev);
        }
        if ((uVar25 & 0xc) == 0 || (uVar25 >> 0xc & 1) != 0) {
          archive_entry_set_gid(entry,(ulong)st_storage.st_gid);
        }
        if ((uVar25 & 0x600) == 0 || (uVar25 >> 0xc & 1) != 0) {
          archive_entry_set_uid(entry,(ulong)st_storage.st_uid);
        }
        if ((uVar25 & 0x1010) != 0x10) {
          archive_entry_set_mtime(entry,st_storage.st_mtim.tv_sec,st_storage.st_mtim.tv_nsec);
        }
        if ((uVar25 & 0x1020) != 0x20) {
          archive_entry_set_nlink(entry,(uint)st_storage.st_nlink);
        }
        if ((uVar25 & 0x1040) != 0x40) {
          archive_entry_set_perm(entry,p);
        }
        if ((uVar25 & 0x1080) != 0x80) {
          archive_entry_set_size(entry,st_storage.st_size);
        }
        archive_entry_set_ino(entry,st_storage.st_ino);
        archive_entry_set_dev(entry,st_storage.st_dev);
        archive_entry_linkify(mtree->resolver,(archive_entry **)&global,&sparse_entry);
        entry = (archive_entry *)global;
LAB_0013214c:
        iVar14 = archive_entry_size(entry);
        mtree->cur_size = iVar14;
        mtree->offset = 0;
        return iVar4;
      }
      iVar5 = fstat(iVar5,(stat *)&st_storage);
      if (iVar5 != -1) goto LAB_00131943;
      piVar7 = __errno_location();
      archive_set_error(&a->archive,*piVar7,"Could not fstat %s",pcVar15);
      close(mtree->fd);
      mtree->fd = -1;
      iVar4 = -0x14;
LAB_0013197c:
      if ((local_fc & 0x800) == 0) goto LAB_0013214c;
LAB_00131a94:
      pmVar21 = mtree->this_entry;
    }
    pmVar21 = pmVar21->next;
    mtree->this_entry = pmVar21;
  } while( true );
LAB_00131bfb:
  if (pvVar8 != (void *)0x0) goto LAB_00131c2f;
LAB_00131c03:
  lVar18 = (long)pcVar15 - (long)pmVar21;
  uVar23 = uStack_120;
  goto LAB_00131b10;
LAB_00131c2f:
  if (uStack_120 == 0) {
LAB_0013218f:
    mtree->this_entry = mtree->entries;
    uStack_120 = 0;
    goto LAB_001321d0;
  }
  pmVar19 = pmVar21;
  if ((long)uStack_120 < 0) goto LAB_001321d0;
  while( true ) {
    uVar13 = (ulong)*(byte *)&pmVar19->next;
    if (0x2f < uVar13) goto LAB_00131d6c;
    if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) break;
    uStack_120 = uStack_120 - 1;
    pmVar19 = (mtree_entry *)((long)&pmVar19->next + 1);
  }
  if ((0x800002401U >> (uVar13 & 0x3f) & 1) != 0) goto LAB_00131c7c;
  if (uVar13 != 0x2f) goto LAB_00131d6c;
  iVar4 = strncmp((char *)pmVar19,"/set",4);
  if (iVar4 == 0) {
    cVar1 = *(char *)((long)&pmVar19->next + 4);
    if ((cVar1 == ' ') || (cVar1 == '\t')) {
      pcVar15 = (char *)((long)&pmVar19->next + 4);
      goto LAB_00131e38;
    }
  }
  else {
    iVar4 = strncmp((char *)pmVar19,"/unset",6);
    if ((iVar4 == 0) &&
       ((cVar1 = *(char *)((long)&pmVar19->next + 6), cVar1 == ' ' || (cVar1 == '\t')))) {
      pcVar16 = (char *)((long)&pmVar19->next + 6);
      pcVar15 = strchr(pcVar16,0x3d);
      if (pcVar15 == (char *)0x0) goto LAB_00131cfa;
      archive_set_error(&a->archive,-1,"/unset shall not contain `=\'");
LAB_001321c2:
      uStack_120 = 0xffffffffffffffe2;
LAB_001321d0:
      free_options(global);
      if ((int)uStack_120 != 0) {
        return (int)uStack_120;
      }
      goto LAB_00131707;
    }
  }
  archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_d8);
  goto LAB_001321c2;
LAB_00131d6c:
  local_e8 = (mtree_option **)st_storage.st_dev;
  pmVar11 = (mtree_entry *)malloc(0x20);
  if (pmVar11 != (mtree_entry *)0x0) {
    *(undefined8 *)((long)&pmVar11->options + 2) = 0;
    *(undefined8 *)((long)&pmVar11->name + 2) = 0;
    pmVar11->next = (mtree_entry *)0x0;
    pmVar11->options = (mtree_option *)0x0;
    pmVar12 = local_f8;
    if (local_f8 == (mtree_entry *)0x0) {
      pmVar12 = local_c8;
    }
    pmVar12->next = pmVar11;
    if (iVar4 == 0) {
      local_f8 = (mtree_entry *)strcspn((char *)pmVar19," \t\r\n");
      pmVar12 = (mtree_entry *)((long)&pmVar19->next + (long)&local_f8->next);
      pmVar21 = pmVar19;
      pmVar19 = pmVar12;
      pmVar12 = (mtree_entry *)((long)&pmVar12->next + uStack_120);
    }
    else {
      uVar13 = (long)uStack_120 >> 0x3f & uStack_120;
      pmVar21 = (mtree_entry *)((long)local_e8 + (long)&pmVar21->next + uVar23);
      while (((pmVar21 = (mtree_entry *)((long)pmVar21 + -1), uVar23 = uVar13, 0 < (long)uStack_120
              && (uVar23 = uStack_120, (ulong)*(byte *)pmVar21 < 0x21)) &&
             ((0x100002600U >> ((ulong)*(byte *)pmVar21 & 0x3f) & 1) != 0))) {
        uStack_120 = uStack_120 - 1;
      }
      local_f8 = (mtree_entry *)0x0;
      for (; pmVar12 = pmVar21, 0 < (long)uVar23; uVar23 = uVar23 - 1) {
        if (((ulong)*(byte *)&pmVar21->next < 0x21) &&
           ((0x100002600U >> ((ulong)*(byte *)&pmVar21->next & 0x3f) & 1) != 0)) {
          pmVar21 = (mtree_entry *)((long)&pmVar21->next + 1);
          pmVar12 = pmVar21;
          break;
        }
        pmVar21 = (mtree_entry *)&pmVar21[-1].field_0x1f;
        local_f8 = (mtree_entry *)((long)&local_f8->next + 1);
      }
    }
    pcVar15 = (char *)malloc((size_t)((long)&local_f8->next + 1));
    pmVar2 = local_f8;
    pmVar11->name = pcVar15;
    if (pcVar15 != (char *)0x0) {
      local_e8 = &pmVar11->options;
      memcpy(pcVar15,pmVar21,(size_t)local_f8);
      ppmVar3 = local_e8;
      pcVar15[(long)pmVar2] = '\0';
      local_e0 = pmVar11;
      parse_escapes(pcVar15,pmVar11);
      pmVar22 = (mtree_option *)&global;
      while (pmVar22 = pmVar22->next, pmVar22 != (mtree_option *)0x0) {
        pcVar15 = pmVar22->value;
        sVar10 = strlen(pcVar15);
        uVar25 = add_option(a,ppmVar3,pcVar15,sVar10);
        if (uVar25 != 0) goto LAB_001321c8;
      }
      while ((sVar10 = strspn((char *)pmVar19," \t\r\n"),
             *(char *)((long)&pmVar19->next + sVar10) != '\0' &&
             (pmVar21 = (mtree_entry *)((long)&pmVar19->next + sVar10), pmVar21 < pmVar12))) {
        len = strcspn((char *)pmVar21," \t\r\n");
        pmVar19 = (mtree_entry *)((long)&pmVar21->next + len);
        local_f8 = pmVar19;
        pmVar11 = (mtree_entry *)strchr((char *)pmVar21,0x3d);
        ppmVar3 = local_e8;
        sVar10 = (long)pmVar11 - (long)pmVar21;
        if (pmVar19 < pmVar11) {
          sVar10 = len;
        }
        if (pmVar11 == (mtree_entry *)0x0) {
          sVar10 = len;
        }
        remove_option(local_e8,(char *)pmVar21,sVar10);
        uVar25 = add_option(a,ppmVar3,(char *)pmVar21,len);
        pmVar19 = local_f8;
        if (uVar25 != 0) goto LAB_001321c8;
      }
      local_f8 = local_e0;
      goto LAB_00131c7c;
    }
  }
  piVar7 = __errno_location();
  archive_set_error(&a->archive,*piVar7,"Can\'t allocate memory");
  uStack_120 = 0xffffffffffffffe2;
  goto LAB_001321d0;
LAB_001321c8:
  uStack_120 = (ulong)uVar25;
  goto LAB_001321d0;
LAB_00131e38:
  sVar10 = strspn(pcVar15," \t\r\n");
  if (pcVar15[sVar10] == '\0') goto LAB_00131c7c;
  pcVar20 = pcVar15 + sVar10;
  sVar10 = strcspn(pcVar20," \t\r\n");
  pcVar15 = pcVar20 + sVar10;
  pcVar16 = strchr(pcVar20,0x3d);
  sVar17 = (long)pcVar16 - (long)pcVar20;
  if (pcVar15 < pcVar16) {
    sVar17 = sVar10;
  }
  remove_option(&global,pcVar20,sVar17);
  uVar25 = add_option(a,&global,pcVar20,sVar10);
  if (uVar25 != 0) {
    uStack_120 = (ulong)uVar25;
    goto LAB_001321d0;
  }
  goto LAB_00131e38;
LAB_00131cfa:
  while( true ) {
    sVar10 = strspn(pcVar16," \t\r\n");
    cVar1 = pcVar16[sVar10];
    if (cVar1 == '\0') break;
    pcVar16 = pcVar16 + sVar10;
    sVar10 = strcspn(pcVar16," \t\r\n");
    if (((cVar1 == 'a' && sVar10 == 3) && (pcVar16[1] == 'l')) && (pcVar16[2] == 'l')) {
      free_options(global);
      global = (mtree_option *)0x0;
    }
    else {
      remove_option(&global,pcVar16,sVar10);
    }
    pcVar16 = pcVar16 + sVar10;
  }
LAB_00131c7c:
  local_d8 = local_d8 + 1;
  goto LAB_00131b0b;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry, &use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}